

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

void __thiscall Potassco::AspifTextOutput::endStep(AspifTextOutput *this)

{
  pointer puVar1;
  pointer pppVar2;
  Data *pDVar3;
  
  visitTheories(this);
  push(this,0);
  writeDirectives(this);
  pDVar3 = this->data_;
  puVar1 = (pDVar3->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pDVar3->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar3->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar3->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    pDVar3 = this->data_;
  }
  pppVar2 = (pDVar3->out).
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (pDVar3->out).
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar3->out).
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar3->out).
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pppVar2 != (pointer)0x0) {
    operator_delete(pppVar2);
  }
  if (-1 < this->step_) {
    return;
  }
  TheoryData::reset(&this->theory_);
  return;
}

Assistant:

void AspifTextOutput::endStep() {
	visitTheories();
	push(Directive_t::End);
	writeDirectives();
	Data::RawVec().swap(data_->directives);
	Data::OutOrder().swap(data_->out);
	if (step_ < 0) { theory_.reset();  }
}